

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  Float FVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  float fVar15;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 in_register_000013c4 [12];
  Point3f PVar22;
  Vector3f dpdx;
  SampledSpectrum SVar23;
  Vector3f dpdy;
  uint local_d8;
  undefined8 local_c8;
  float fStack_c0;
  undefined1 auStack_bc [8];
  float fStack_b4;
  undefined8 uStack_b0;
  float fStack_a8;
  undefined1 auStack_a4 [8];
  float afStack_9c [13];
  undefined8 local_68;
  undefined4 local_60;
  RGB local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  RGBAlbedoSpectrum local_24;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_30.x = 0.0;
  local_30.y = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_30.z = 0.0;
  local_40.z = 0.0;
  PVar22 = TransformMapping3D::Map
                     ((TransformMapping3D *)
                      ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                      0xffffffffffff),ctx,(Vector3f *)&local_30,(Vector3f *)&local_40);
  fVar1 = this->scale;
  fVar11 = PVar22.super_Tuple3<pbrt::Point3,_float>.x * fVar1;
  fVar15 = PVar22.super_Tuple3<pbrt::Point3,_float>.y * fVar1;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * local_40.x;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * local_40.y;
  auVar10 = vmovshdup_avx(CONCAT412(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x * fVar1,
                                    CONCAT48(ctx.p.super_Tuple3<pbrt::Point3,_float>.z * fVar1,
                                             CONCAT44(fVar15,fVar11))));
  FVar2 = this->variation;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * local_30.x;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * local_30.y;
  PVar22.super_Tuple3<pbrt::Point3,_float>.z = PVar22.super_Tuple3<pbrt::Point3,_float>.z * fVar1;
  PVar22.super_Tuple3<pbrt::Point3,_float>.x = fVar11;
  PVar22.super_Tuple3<pbrt::Point3,_float>.y = fVar15;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 * local_30.z;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 * local_40.z;
  auVar13._0_4_ = FBm(PVar22,dpdx,dpdy,this->omega,this->octaves);
  auVar13._4_60_ = extraout_var;
  local_d8 = auVar10._0_4_;
  auVar10 = vfmadd213ss_fma(auVar13._0_16_,ZEXT416((uint)FVar2),ZEXT416(local_d8));
  auVar14._0_4_ = sinf(auVar10._0_4_);
  auVar14._4_60_ = extraout_var_00;
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar14._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  local_c8 = 0x3f147ae13f147ae1;
  _fStack_c0 = 0x3f147ae13f19999a;
  stack0xffffffffffffff48 = 0x3f19999a3f147ae1;
  uStack_b0 = 0x3f147ae13f147ae1;
  _fStack_a8 = 0x3f0000003f19999a;
  stack0xffffffffffffff60 = 0x3f0000003f000000;
  afStack_9c[1] = 0.6;
  afStack_9c[2] = 0.59;
  afStack_9c[3] = 0.58;
  afStack_9c[4] = 0.58;
  afStack_9c[5] = 0.58;
  afStack_9c[6] = 0.6;
  afStack_9c[7] = 0.58;
  afStack_9c[8] = 0.58;
  afStack_9c[9] = 0.6;
  afStack_9c[10] = 0.2;
  afStack_9c[0xb] = 0.2;
  afStack_9c[0xc] = 0.33;
  auVar10._8_4_ = 0x3f147ae1;
  auVar10._0_8_ = 0x3f147ae13f147ae1;
  auVar10._12_4_ = 0x3f147ae1;
  local_68 = vmovlps_avx(auVar10);
  local_60 = 0x3f19999a;
  auVar10 = ZEXT416((uint)(auVar7._0_4_ * 6.0));
  auVar10 = vroundss_avx(auVar10,auVar10,9);
  iVar9 = 5;
  if ((int)auVar10._0_4_ < 5) {
    iVar9 = (int)auVar10._0_4_;
  }
  auVar17._0_4_ = (float)iVar9;
  auVar17._4_12_ = in_register_000013c4;
  lVar8 = (long)iVar9;
  auVar10 = vfmsub231ss_fma(auVar17,SUB6416(ZEXT464(0x40c00000),0),auVar7);
  fVar16 = auVar10._0_4_;
  fVar6 = 1.0 - fVar16;
  fVar1 = fVar6 * (&fStack_b4)[lVar8 * 3] + fVar16 * (&fStack_a8)[lVar8 * 3];
  uVar3 = *(undefined8 *)((long)&local_c8 + lVar8 * 0xc);
  local_50.b = (fVar6 * (fVar6 * (fVar6 * (&fStack_c0)[lVar8 * 3] + fVar16 * (&fStack_b4)[lVar8 * 3]
                                 ) + fVar16 * fVar1) +
               fVar16 * (fVar6 * fVar1 +
                        fVar16 * (fVar6 * (&fStack_a8)[lVar8 * 3] + fVar16 * afStack_9c[lVar8 * 3]))
               ) * 1.5;
  fVar1 = (float)*(undefined8 *)(auStack_bc + lVar8 * 0xc);
  fVar15 = (float)((ulong)*(undefined8 *)(auStack_bc + lVar8 * 0xc) >> 0x20);
  uVar4 = *(undefined8 *)((long)&uStack_b0 + lVar8 * 0xc);
  fVar11 = (float)uVar4;
  fVar5 = (float)((ulong)uVar4 >> 0x20);
  fVar18 = fVar6 * fVar1 + fVar16 * fVar11;
  fVar19 = fVar6 * fVar15 + fVar16 * fVar5;
  fVar20 = fVar6 * 0.0 + fVar16 * 0.0;
  fVar21 = fVar6 * 0.0 + fVar16 * 0.0;
  auVar12._0_4_ =
       fVar6 * (fVar6 * (fVar6 * (float)uVar3 + fVar16 * fVar1) + fVar16 * fVar18) +
       fVar16 * (fVar6 * fVar18 +
                fVar16 * (fVar6 * fVar11 + fVar16 * (float)*(undefined8 *)(auStack_a4 + lVar8 * 0xc)
                         ));
  auVar12._4_4_ =
       fVar6 * (fVar6 * (fVar6 * (float)((ulong)uVar3 >> 0x20) + fVar16 * fVar15) + fVar16 * fVar19)
       + fVar16 * (fVar6 * fVar19 +
                  fVar16 * (fVar6 * fVar5 +
                           fVar16 * (float)((ulong)*(undefined8 *)(auStack_a4 + lVar8 * 0xc) >> 0x20
                                           )));
  auVar12._8_4_ =
       fVar6 * (fVar6 * (fVar6 * 0.0 + fVar16 * 0.0) + fVar16 * fVar20) +
       fVar16 * (fVar6 * fVar20 + fVar16 * (fVar6 * 0.0 + fVar16 * 0.0));
  auVar12._12_4_ =
       fVar6 * (fVar6 * (fVar6 * 0.0 + fVar16 * 0.0) + fVar16 * fVar21) +
       fVar16 * (fVar6 * fVar21 + fVar16 * (fVar6 * 0.0 + fVar16 * 0.0));
  auVar7._8_4_ = 0x3fc00000;
  auVar7._0_8_ = 0x3fc000003fc00000;
  auVar7._12_4_ = 0x3fc00000;
  auVar10 = vmulps_avx512vl(auVar12,auVar7);
  local_50._0_8_ = vmovlps_avx(auVar10);
  RGBAlbedoSpectrum::RGBAlbedoSpectrum(&local_24,RGBColorSpace::sRGB,&local_50);
  SVar23 = RGBAlbedoSpectrum::Sample(&local_24,&lambda);
  return (array<float,_4>)(array<float,_4>)SVar23;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at $t$ to compute color _rgb_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = t * nSeg - first;
    RGB rgb = 1.5f * EvaluateCubicBezier(pstd::span(c + first, 4), t);

#ifdef PBRT_IS_GPU_CODE
    return RGBAlbedoSpectrum(*RGBColorSpace_sRGB, rgb).Sample(lambda);
#else
    return RGBAlbedoSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
#endif
}